

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::DisableForkStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DisableForkStatementSyntax *this,size_t index)

{
  __index_type _Var1;
  undefined4 uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  switch(index) {
  case 0:
    *(NamedLabelSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         (this->super_StatementSyntax).label;
    goto LAB_002ba073;
  case 1:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
LAB_002ba073:
    _Var1 = '\x01';
    goto LAB_002ba081;
  case 2:
    uVar2._0_2_ = (this->disable).kind;
    uVar2._2_1_ = (this->disable).field_0x2;
    uVar2._3_1_ = (this->disable).numFlags;
    uVar3 = (this->disable).rawLen;
    uVar4 = *(undefined4 *)&(this->disable).info;
    uVar5 = *(undefined4 *)((long)&(this->disable).info + 4);
    break;
  case 3:
    uVar2._0_2_ = (this->fork).kind;
    uVar2._2_1_ = (this->fork).field_0x2;
    uVar2._3_1_ = (this->fork).numFlags;
    uVar3 = (this->fork).rawLen;
    uVar4 = *(undefined4 *)&(this->fork).info;
    uVar5 = *(undefined4 *)((long)&(this->fork).info + 4);
    break;
  case 4:
    uVar2._0_2_ = (this->semi).kind;
    uVar2._2_1_ = (this->semi).field_0x2;
    uVar2._3_1_ = (this->semi).numFlags;
    uVar3 = (this->semi).rawLen;
    uVar4 = *(undefined4 *)&(this->semi).info;
    uVar5 = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_002ba07f;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar2;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar5;
LAB_002ba07f:
  _Var1 = '\0';
LAB_002ba081:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DisableForkStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return disable;
        case 3: return fork;
        case 4: return semi;
        default: return nullptr;
    }
}